

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

CURLcode telnet_done(connectdata *conn,CURLcode status,_Bool premature)

{
  HTTP *pHVar1;
  void *pvVar2;
  
  pHVar1 = (conn->data->state).proto.http;
  if (pHVar1 != (HTTP *)0x0) {
    curl_slist_free_all((curl_slist *)pHVar1[0x36].sendit);
    pHVar1[0x36].sendit = (FormData *)0x0;
    pvVar2 = (conn->data->state).proto.telnet;
    if (pvVar2 != (void *)0x0) {
      (*Curl_cfree)(pvVar2);
      (conn->data->state).proto.http = (HTTP *)0x0;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode telnet_done(struct connectdata *conn,
                                 CURLcode status, bool premature)
{
  struct TELNET *tn = (struct TELNET *)conn->data->state.proto.telnet;
  (void)status; /* unused */
  (void)premature; /* not used */

  if(!tn)
    return CURLE_OK;

  curl_slist_free_all(tn->telnet_vars);
  tn->telnet_vars = NULL;

  Curl_safefree(conn->data->state.proto.telnet);

  return CURLE_OK;
}